

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>::eraseLast
          (QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *this)

{
  qsizetype *pqVar1;
  long lVar2;
  HistoryEntry *pHVar3;
  Data *pDVar4;
  
  lVar2 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size;
  pHVar3 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).ptr;
  pDVar4 = pHVar3[lVar2 + -1].title.d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&(pHVar3[lVar2 + -1].title.d.d)->super_QArrayData,2,0x10);
    }
  }
  QUrl::~QUrl(&pHVar3[lVar2 + -1].url);
  pqVar1 = &(this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }